

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

bool __thiscall Core::error(Core *this,string *s,bool b)

{
  ostream *poVar1;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,b) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "\x1b[1;31mReclone the repo is recommended if you\'re missing ressources (rsrc)!\x1b[0m\n"
               ,0x50);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\x1b[1;31m",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(s->_M_dataplus)._M_p,s->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,anon_var_dwarf_9bde,0xb);
  return false;
}

Assistant:

bool Core::error(const std::string &s, bool b) const
{
    if (b)
        std::cerr << "\033[1;31mReclone the repo is recommended if you're missing ressources (rsrc)!\033[0m\n";
    std::cerr << "\033[1;31m" << s << " è_é\033[0m\n";
    return false;
}